

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          int num_digits,string_view prefix,basic_format_specs<wchar_t> *spec,num_writer f)

{
  int value;
  type tVar1;
  type tVar2;
  size_t sVar3;
  alignment aVar4;
  ulong uVar5;
  ulong uVar6;
  align_spec as;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<int,_fmt::v5::basic_format_specs<wchar_t>_>::num_writer>
  local_68;
  
  sVar3 = prefix.size_;
  tVar1 = internal::to_unsigned<int>(num_digits);
  uVar6 = tVar1 + sVar3;
  local_68.fill = (spec->super_align_spec).fill_;
  aVar4 = (spec->super_align_spec).align_;
  if (aVar4 == ALIGN_NUMERIC) {
    uVar5 = (ulong)(spec->super_align_spec).width_;
    local_68.size_ = uVar5;
    if (uVar5 < uVar6) {
      local_68.size_ = uVar6;
    }
    local_68.padding = 0;
    if (uVar6 <= uVar5) {
      local_68.padding = uVar5 - uVar6;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
  }
  else {
    value = (spec->super_core_format_specs).precision;
    if (num_digits < value) {
      tVar1 = internal::to_unsigned<int>(value);
      tVar2 = internal::to_unsigned<int>((spec->super_core_format_specs).precision - num_digits);
      local_68.padding = (size_t)tVar2;
      aVar4 = (spec->super_align_spec).align_;
      local_68.fill = L'0';
      local_68.size_ = tVar1 + sVar3;
    }
    else {
      local_68.padding = 0;
      local_68.size_ = uVar6;
    }
    as.align_ = (spec->super_align_spec).align_;
    as.width_ = (spec->super_align_spec).width_;
    as.fill_ = (spec->super_align_spec).fill_;
    if (aVar4 == ALIGN_DEFAULT) {
      as.align_ = ALIGN_RIGHT;
    }
  }
  local_68.f.abs_value = f.abs_value;
  local_68.f.size = f.size;
  local_68.f.sep = f.sep;
  local_68.prefix.data_ = prefix.data_;
  local_68.prefix.size_ = sVar3;
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::num_writer>>
            (this,&as,&local_68);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }